

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void int_linear_imp(vec<int> *a,vec<IntVar_*> *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  BoolView local_50;
  BoolView local_40;
  
  iVar3 = -c;
  if (0 < c) {
    iVar3 = c;
  }
  dVar5 = (double)iVar3;
  bVar1 = false;
  for (uVar4 = 0; x->sz != uVar4; uVar4 = uVar4 + 1) {
    bVar2 = true;
    if (a->data[uVar4] == -1) {
      bVar2 = bVar1;
    }
    if (a->data[uVar4] == 1) {
      bVar2 = bVar1;
    }
    bVar1 = bVar2;
    dVar5 = dVar5 + 2147483647.0;
  }
  if (9.223372036854776e+18 <= dVar5) {
    fprintf(_stderr,"%s:%d: ","linear.cpp",0x1b3);
    fwrite("Linear constraint may overflow, not yet supported\n",0x32,1,_stderr);
    abort();
  }
  bVar2 = BoolView::isTrue(r);
  if (!bVar2) {
    if (bVar1) {
      local_40.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_40.v = r->v;
      local_40.s = r->s;
      int_linear_imp<1>(a,x,t,c,&local_40);
    }
    else {
      local_50.super_Var.super_Branching._vptr_Branching = (Branching)&PTR_finished_001efbb8;
      local_50.v = r->v;
      local_50.s = r->s;
      int_linear_imp<0>(a,x,t,c,&local_50);
    }
    return;
  }
  if (bVar1) {
    int_linear<1>(a,x,t,c);
    return;
  }
  int_linear<0>(a,x,t,c);
  return;
}

Assistant:

void int_linear_imp(vec<int>& a, vec<IntVar*>& x, IntRelType t, int c, const BoolView& r) {
	assert(a.size() == x.size());

	bool scale = false;
	double limit = abs(c);
	for (unsigned int i = 0; i < x.size(); i++) {
		assert(a[i]);
		if (a[i] != 1 && a[i] != -1) {
			scale = true;
		}
		limit += abs(a[i]) * IntVar::max_limit + INT_MAX;
	}
	if (limit >= INT64_MAX) {
		CHUFFED_ERROR("Linear constraint may overflow, not yet supported\n");
	}

	if (r.isTrue()) {
		if (scale) {
			int_linear<1>(a, x, t, c);
		} else {
			int_linear<0>(a, x, t, c);
		}
	} else {
		if (scale) {
			int_linear_imp<1>(a, x, t, c, r);
		} else {
			int_linear_imp<0>(a, x, t, c, r);
		}
	}
}